

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall clog::Logger::Impl::finish(Impl *this)

{
  char **ppcVar1;
  char *pcVar2;
  ulong __n;
  LogStream *pLVar3;
  char **ppcVar4;
  
  ppcVar4 = &(this->_stream)._buffer.cur_;
  pcVar2 = (this->_stream)._buffer.cur_;
  if (3 < (ulong)((long)ppcVar4 - (long)pcVar2)) {
    pcVar2[2] = ' ';
    pcVar2[0] = ' ';
    pcVar2[1] = '-';
    *ppcVar4 = *ppcVar4 + 3;
  }
  __n = (this->_file)._size;
  pcVar2 = (this->_stream)._buffer.cur_;
  if (__n < (ulong)((long)ppcVar4 - (long)pcVar2)) {
    memcpy(pcVar2,(this->_file)._data,__n);
    ppcVar1 = &(this->_stream)._buffer.cur_;
    *ppcVar1 = *ppcVar1 + __n;
  }
  if (1 < (ulong)((long)ppcVar4 - (long)*ppcVar4)) {
    **ppcVar4 = ':';
    *ppcVar4 = *ppcVar4 + 1;
  }
  pLVar3 = LogStream::operator<<(&this->_stream,this->_line);
  pcVar2 = (pLVar3->_buffer).cur_;
  ppcVar4 = &(pLVar3->_buffer).cur_;
  if (1 < (ulong)((long)ppcVar4 - (long)pcVar2)) {
    *pcVar2 = '\n';
    *ppcVar4 = *ppcVar4 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
    _stream << " - " << _file << ":" << _line << "\n\0"; 
}